

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

string * __thiscall
pbrt::ParameterDictionary::ToParameterList_abi_cxx11_
          (string *__return_storage_ptr__,ParameterDictionary *this,int indentCount)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParameterDictionary *this_00;
  int indentCount_00;
  undefined4 in_register_00000014;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  long lVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar3 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar3 = paVar1;
  }
  if (sVar2 != 0) {
    lVar4 = 0;
    do {
      this_00 = *(ParameterDictionary **)((long)paVar3 + lVar4);
      indentCount_00 = indentCount + 4;
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 (char)(indentCount + 4));
      ToParameterDefinition_abi_cxx11_
                (&local_50,this_00,(ParsedParameter *)CONCAT44(in_register_00000014,indentCount),
                 indentCount_00);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar4 = lVar4 + 8;
    } while (sVar2 << 3 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::ToParameterList(int indentCount) const {
    std::string s;
    for (const ParsedParameter *p : params) {
        s.append(indentCount + 4, ' ');
        s += ToParameterDefinition(p, indentCount);
        s += "\n";
    }

    return s;
}